

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O0

int CaptureSummary::compare_string(char *x,char *y)

{
  bool bVar1;
  int local_1c;
  uint8_t uy;
  uint8_t ux;
  byte *pbStack_18;
  int ret;
  char *y_local;
  char *x_local;
  
  local_1c = 0;
  pbStack_18 = (byte *)y;
  y_local = x;
  while( true ) {
    bVar1 = false;
    if (*y_local == *pbStack_18) {
      bVar1 = *y_local != '\0';
    }
    if (!bVar1) break;
    y_local = y_local + 1;
    pbStack_18 = pbStack_18 + 1;
  }
  if ((byte)*y_local < *pbStack_18) {
    local_1c = 1;
  }
  else if (*pbStack_18 < (byte)*y_local) {
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

int CaptureSummary::compare_string(char const * x, char const * y)
{
    int ret = 0;
    uint8_t ux, uy;

    while (*x == *y && *x != 0)
    {
        x++;
        y++;
    }

    ux = (uint8_t)*x;
    uy = (uint8_t)*y;

    if (ux < uy)
    {
        ret = 1;
    }
    else if (ux > uy)
    {
        ret = -1;
    }

    return ret;
}